

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

string * __thiscall
wabt::cat<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,wabt *this,char (*args) [3],char **args_1,
          char (*args_2) [2],basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
            ((char (*) [3])this,(char **)args,(char (*) [2])args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)args_2);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,(char (*) [3])this,(char **)args,(char (*) [2])args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)args_2);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}